

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<char32_t>::addAll<char32_t*,true>
          (ArrayBuilder<char32_t> *this,char32_t *start,char32_t *end)

{
  char32_t *pcVar1;
  char32_t *end_local;
  char32_t *start_local;
  ArrayBuilder<char32_t> *this_local;
  
  pcVar1 = kj::_::CopyConstructArray_<char32_t,_char32_t_*,_true,_false>::apply(this->pos,start,end)
  ;
  this->pos = pcVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}